

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSEQDecStop(octet *der,der_anchor_t *anchor)

{
  octet *poVar1;
  size_t len;
  size_t sVar2;
  size_t sVar3;
  
  poVar1 = anchor->der;
  sVar2 = derTEnc((octet *)0x0,anchor->tag);
  len = anchor->len;
  sVar3 = derLEnc((octet *)0x0,len);
  return -(ulong)(poVar1 + sVar3 + sVar2 + len != der || der < poVar1 + sVar3 + sVar2);
}

Assistant:

size_t derTSEQDecStop(const octet der[], const der_anchor_t* anchor)
{
	const octet* val;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// определить начало вложенных данных
	val = anchor->der + derTEnc(0, anchor->tag) + derLEnc(0, anchor->len);
	if (val > der)
		return SIZE_MAX;
	// сравнить длину вложенных данных с сохраненной длиной
	return (der == val + anchor->len) ? 0 : SIZE_MAX;
}